

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

string * SpellSerialize(string *__return_storage_ptr__,
                       list<Character_Spell,_std::allocator<Character_Spell>_> *list)

{
  bool bVar1;
  reference pCVar2;
  int subject;
  int subject_00;
  string local_90;
  string local_60;
  Character_Spell local_3c;
  const_iterator cStack_38;
  Character_Spell spell;
  const_iterator __end1;
  const_iterator __begin1;
  list<Character_Spell,_std::allocator<Character_Spell>_> *__range1;
  list<Character_Spell,_std::allocator<Character_Spell>_> *list_local;
  string *serialized;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::begin(list);
  cStack_38 = std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::end(list);
  while (bVar1 = std::operator!=(&__end1,&stack0xffffffffffffffc8), bVar1) {
    pCVar2 = std::_List_const_iterator<Character_Spell>::operator*(&__end1);
    local_3c = *pCVar2;
    util::to_string_abi_cxx11_(&local_60,(util *)(ulong)(uint)(int)local_3c.id,subject);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    util::to_string_abi_cxx11_(&local_90,(util *)(ulong)local_3c.level,subject_00);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::_List_const_iterator<Character_Spell>::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SpellSerialize(const std::list<Character_Spell> &list)
{
	std::string serialized;

	UTIL_FOREACH(list, spell)
	{
		serialized.append(util::to_string(spell.id));
		serialized.append(",");
		serialized.append(util::to_string(spell.level));
		serialized.append(";");
	}

	return serialized;
}